

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

void ggml_cpu_init(void)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar4 [64];
  undefined1 auVar3 [16];
  undefined1 auVar5 [64];
  uint64_t t_end;
  float f;
  anon_union_2_2_620870ce u;
  int i;
  uint64_t t_start;
  ggml_context *ctx;
  ggml_init_params params;
  ggml_fp16_t local_36;
  int local_2c;
  undefined1 local_18 [24];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  memset(local_18,0,0x18);
  uVar1 = ggml_init();
  ggml_free(uVar1);
  ggml_critical_section_start();
  if ((ggml_cpu_init::is_first_call & 1U) != 0) {
    ggml_time_us();
    for (local_2c = 0; local_2c < 0x10000; local_2c = local_2c + 1) {
      ggml_lookup_fp16_to_fp32((ggml_fp16_t)local_2c);
      auVar4._0_4_ = ggml_gelu_f32(0.0);
      auVar4._4_60_ = extraout_var;
      auVar2._0_12_ = ZEXT412(0);
      auVar2._12_4_ = 0;
      auVar3 = vblendps_avx(auVar2,auVar4._0_16_,1);
      auVar3 = vcvtps2ph_f16c(auVar3,0);
      vpextrw_avx(auVar3,0);
      ggml_table_gelu_f16[local_2c] = local_36;
      auVar5._0_4_ = ggml_gelu_quick_f32(0.0);
      auVar5._4_60_ = extraout_var_00;
      auVar3 = vblendps_avx(auVar2,auVar5._0_16_,1);
      auVar3 = vcvtps2ph_f16c(auVar3,0);
      ggml_table_gelu_quick_f16[local_2c] = auVar3._0_2_;
    }
    ggml_time_us();
    ggml_cpu_init::is_first_call = false;
  }
  ggml_critical_section_end();
  return;
}

Assistant:

void ggml_cpu_init(void) {
    // needed to initialize f16 tables
    {
        struct ggml_init_params params = { 0, NULL, false };
        struct ggml_context * ctx = ggml_init(params);
        ggml_free(ctx);
    }

    ggml_critical_section_start();

    static bool is_first_call = true;

    if (is_first_call) {
        // initialize GELU, Quick GELU, SILU and EXP F32 tables
        {
            const uint64_t t_start = ggml_time_us(); UNUSED(t_start);

            for (int i = 0; i < (1 << 16); ++i) {
                union {
                    uint16_t u16;
                    ggml_fp16_t fp16;
                } u = {i};
                float f = GGML_FP16_TO_FP32(u.fp16);
                ggml_table_gelu_f16[i] = GGML_FP32_TO_FP16(ggml_gelu_f32(f));
                ggml_table_gelu_quick_f16[i] = GGML_FP32_TO_FP16(ggml_gelu_quick_f32(f));
            }

            const uint64_t t_end = ggml_time_us(); UNUSED(t_end);

            GGML_PRINT_DEBUG("%s: GELU, Quick GELU, SILU and EXP tables initialized in %f ms\n", __func__, (t_end - t_start)/1000.0);
        }

#if defined(__ARM_ARCH)
        ggml_init_arm_arch_features();
#endif

        is_first_call = false;
    }

    ggml_critical_section_end();
}